

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O2

void __thiscall
btTriangleMesh::btTriangleMesh(btTriangleMesh *this,bool use32bitIndices,bool use4componentVertices)

{
  bool bVar1;
  btIndexedMesh *pbVar2;
  btAlignedObjectArray<unsigned_int> *pbVar3;
  int iVar4;
  int iVar5;
  btIndexedMesh local_60;
  
  btTriangleIndexVertexArray::btTriangleIndexVertexArray(&this->super_btTriangleIndexVertexArray);
  (this->super_btTriangleIndexVertexArray).super_btStridingMeshInterface.
  _vptr_btStridingMeshInterface = (_func_int **)&PTR__btTriangleMesh_001efec0;
  (this->m_4componentVertices).m_ownsMemory = true;
  (this->m_4componentVertices).m_data = (btVector3 *)0x0;
  (this->m_4componentVertices).m_size = 0;
  (this->m_4componentVertices).m_capacity = 0;
  (this->m_3componentVertices).m_ownsMemory = true;
  (this->m_3componentVertices).m_data = (float *)0x0;
  (this->m_3componentVertices).m_size = 0;
  (this->m_3componentVertices).m_capacity = 0;
  (this->m_32bitIndices).m_ownsMemory = true;
  (this->m_32bitIndices).m_data = (uint *)0x0;
  (this->m_32bitIndices).m_size = 0;
  (this->m_32bitIndices).m_capacity = 0;
  (this->m_16bitIndices).m_ownsMemory = true;
  (this->m_16bitIndices).m_data = (unsigned_short *)0x0;
  (this->m_16bitIndices).m_size = 0;
  (this->m_16bitIndices).m_capacity = 0;
  this->m_use32bitIndices = use32bitIndices;
  this->m_use4componentVertices = use4componentVertices;
  this->m_weldingThreshold = 0.0;
  local_60.m_vertexType = PHY_FLOAT;
  local_60.m_numTriangles = 0;
  local_60.m_triangleIndexBase = (uchar *)0x0;
  local_60.m_triangleIndexStride = 0xc;
  local_60.m_numVertices = 0;
  local_60.m_vertexBase = (uchar *)0x0;
  local_60.m_vertexStride = 0x10;
  local_60.m_indexType = PHY_INTEGER;
  btAlignedObjectArray<btIndexedMesh>::push_back
            (&(this->super_btTriangleIndexVertexArray).m_indexedMeshes,&local_60);
  bVar1 = this->m_use32bitIndices;
  pbVar2 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data;
  iVar5 = 0xc;
  iVar4 = 6;
  pbVar3 = (btAlignedObjectArray<unsigned_int> *)&this->m_16bitIndices;
  if (bVar1 != PHY_FLOAT) {
    iVar4 = iVar5;
    pbVar3 = &this->m_32bitIndices;
  }
  pbVar2->m_numTriangles = pbVar3->m_size / 3;
  pbVar2->m_triangleIndexBase = (uchar *)0x0;
  pbVar2->m_indexType = bVar1 ^ PHY_SHORT;
  pbVar2->m_triangleIndexStride = iVar4;
  if (this->m_use4componentVertices == false) {
    iVar4 = (this->m_3componentVertices).m_size / 3;
  }
  else {
    iVar4 = (this->m_4componentVertices).m_size;
    iVar5 = 0x10;
  }
  pbVar2->m_numVertices = iVar4;
  pbVar2->m_vertexBase = (uchar *)0x0;
  pbVar2->m_vertexStride = iVar5;
  return;
}

Assistant:

btTriangleMesh::btTriangleMesh (bool use32bitIndices,bool use4componentVertices)
:m_use32bitIndices(use32bitIndices),
m_use4componentVertices(use4componentVertices),
m_weldingThreshold(0.0)
{
	btIndexedMesh meshIndex;
	meshIndex.m_numTriangles = 0;
	meshIndex.m_numVertices = 0;
	meshIndex.m_indexType = PHY_INTEGER;
	meshIndex.m_triangleIndexBase = 0;
	meshIndex.m_triangleIndexStride = 3*sizeof(int);
	meshIndex.m_vertexBase = 0;
	meshIndex.m_vertexStride = sizeof(btVector3);
	m_indexedMeshes.push_back(meshIndex);

	if (m_use32bitIndices)
	{
		m_indexedMeshes[0].m_numTriangles = m_32bitIndices.size()/3;
		m_indexedMeshes[0].m_triangleIndexBase = 0;
		m_indexedMeshes[0].m_indexType = PHY_INTEGER;
		m_indexedMeshes[0].m_triangleIndexStride = 3*sizeof(int);
	} else
	{
		m_indexedMeshes[0].m_numTriangles = m_16bitIndices.size()/3;
		m_indexedMeshes[0].m_triangleIndexBase = 0;
		m_indexedMeshes[0].m_indexType = PHY_SHORT;
		m_indexedMeshes[0].m_triangleIndexStride = 3*sizeof(short int);
	}

	if (m_use4componentVertices)
	{
		m_indexedMeshes[0].m_numVertices = m_4componentVertices.size();
		m_indexedMeshes[0].m_vertexBase = 0;
		m_indexedMeshes[0].m_vertexStride = sizeof(btVector3);
	} else
	{
		m_indexedMeshes[0].m_numVertices = m_3componentVertices.size()/3;
		m_indexedMeshes[0].m_vertexBase = 0;
		m_indexedMeshes[0].m_vertexStride = 3*sizeof(btScalar);
	}


}